

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O1

ON_wString Internal_VulgarFractionXator(int updown,ON_wString *X)

{
  int iVar1;
  wchar_t *pwVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ON_Internal_Empty_wString *pOVar6;
  ON_wString *in_RDX;
  int iVar7;
  undefined4 in_register_0000003c;
  ON_wString *pOVar8;
  bool bVar9;
  bool bVar10;
  ON__UINT32 cp0;
  ON_wString ator;
  ON_UnicodeErrorParameters e;
  ON__UINT32 u;
  ON_wString local_70;
  int local_64;
  ON_wString *local_60;
  ON_wString *local_58;
  wchar_t *local_50;
  ON_wString local_48;
  ON_UnicodeErrorParameters local_40;
  
  pOVar8 = (ON_wString *)CONCAT44(in_register_0000003c,updown);
  local_64 = (int)X;
  if (local_64 != 0) {
    pwVar2 = in_RDX->m_s;
    pOVar6 = &empty_wstring;
    if (pwVar2 != (wchar_t *)0x0) {
      pOVar6 = (ON_Internal_Empty_wString *)(pwVar2 + -3);
    }
    iVar1 = (pOVar6->header).string_length;
    if (((0 < (long)iVar1) && (pwVar2 != (wchar_t *)0x0)) && (0 < (pOVar6->header).string_capacity))
    {
      local_60 = in_RDX;
      local_58 = pOVar8;
      ON_wString::ON_wString(&local_70);
      ON_wString::ReserveArray(&local_70,(long)iVar1);
      iVar7 = 0;
      bVar9 = false;
      local_50 = pwVar2;
      do {
        local_40.m_error_code_point = ON_UnicodeErrorParameters::MaskErrors.m_error_code_point;
        local_40.m_error_status = ON_UnicodeErrorParameters::MaskErrors.m_error_status;
        local_40.m_error_mask = ON_UnicodeErrorParameters::MaskErrors.m_error_mask;
        u = 0x110000;
        iVar3 = ON_DecodeWideChar(local_50 + iVar7,iVar1 - iVar7,&local_40,
                                  (ON__UINT32 *)&stack0xffffffffffffff8c);
        uVar5 = 0xfffd;
        if ((0 < iVar3) && (iVar4 = ON_IsValidUnicodeCodePoint(u), iVar4 != 0)) {
          if (local_64 < 1) {
            uVar5 = ON_UnicodeSubcriptFromCodePoint(u,u);
          }
          else {
            uVar5 = ON_UnicodeSuperscriptFromCodePoint(u,u);
          }
        }
        bVar10 = bVar9;
        if (uVar5 != u) {
          bVar10 = true;
        }
        if (uVar5 == 0xfffd) {
          bVar10 = bVar9;
        }
        bVar9 = bVar10;
        ON_wString::FromUnicodeCodePoint(u);
        ON_wString::operator+=(&local_70,&local_48);
        ON_wString::~ON_wString(&local_48);
        pOVar8 = local_58;
        if (iVar3 < 1) {
          iVar3 = 1;
        }
        iVar7 = iVar7 + iVar3;
      } while (iVar7 < iVar1);
      if (bVar9) {
        local_60 = &local_70;
      }
      ON_wString::ON_wString(local_58,local_60);
      ON_wString::~ON_wString(&local_70);
      return (ON_wString)(wchar_t *)pOVar8;
    }
    in_RDX = &ON_wString::EmptyString;
  }
  ON_wString::ON_wString(pOVar8,in_RDX);
  return (ON_wString)(wchar_t *)pOVar8;
}

Assistant:

static const ON_wString Internal_VulgarFractionXator(int updown, const ON_wString X)
{
  if (0 == updown)
    return X;

  const int len = X.Length();
  if (len <= 0)
    return ON_wString::EmptyString;
  const wchar_t* s0 = X.Array();
  if (nullptr == s0)
    return ON_wString::EmptyString;


  bool bReturnAtor = false;
  ON_wString ator;
  ator.ReserveArray(len);
  ON_UnicodeErrorParameters e;
  int delta = 0;
  for (int i = 0; i < len; i += ((delta > 0) ? delta : 1))
  {
    e = ON_UnicodeErrorParameters::MaskErrors;
    ON__UINT32 cp0 = ON_UnicodeCodePoint::ON_InvalidCodePoint;
    delta = ON_DecodeWideChar(s0 + i, len - i, &e, &cp0);
    ON__UINT32 cp1
      = (delta > 0 && ON_IsValidUnicodeCodePoint(cp0))
      ? (updown > 0 ? ON_UnicodeSuperscriptFromCodePoint(cp0,cp0) : ON_UnicodeSubcriptFromCodePoint(cp0,cp0))
      : ON_UnicodeCodePoint::ON_ReplacementCharacter;
    if (cp1 != cp0 && cp1 != ON_UnicodeCodePoint::ON_ReplacementCharacter)
      bReturnAtor = true;
    ator += ON_wString::FromUnicodeCodePoint(cp1);
  }

  return bReturnAtor ? ator : X;
}